

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O3

Dwarf_Half __thiscall cpptrace::detail::libdwarf::die_object::get_tag(die_object *this)

{
  int iVar1;
  Dwarf_Half tag;
  undefined6 in_stack_ffffffffffffffe8;
  Dwarf_Half DVar2;
  Dwarf_Error local_10;
  
  DVar2 = 0;
  local_10 = (Dwarf_Error)0x0;
  iVar1 = dwarf_tag(this->die,(Dwarf_Half *)&stack0xffffffffffffffee,&local_10);
  if (iVar1 == 1) {
    handle_dwarf_error(this->dbg,local_10);
  }
  if (iVar1 == 0) {
    return DVar2;
  }
  assert_fail((detail *)0x1,0x18ff26,
              "Dwarf_Half cpptrace::detail::libdwarf::die_object::get_tag() const",
              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
              ,(source_location)ZEXT816(0xb4),(char *)CONCAT26(DVar2,in_stack_ffffffffffffffe8));
}

Assistant:

Dwarf_Half get_tag() const {
            Dwarf_Half tag = 0;
            VERIFY(wrap(dwarf_tag, die, &tag) == DW_DLV_OK);
            return tag;
        }